

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O1

void OpenMD::registerOptimizers(void)

{
  OptimizationFactory *pOVar1;
  OptimizationCreator *pOVar2;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pOVar1 = OptimizationFactory::getInstance();
  pOVar2 = (OptimizationCreator *)operator_new(0x28);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"SD","");
  pOVar2->_vptr_OptimizationCreator = (_func_int **)&PTR__OptimizationCreator_00309fa0;
  (pOVar2->ident_)._M_dataplus._M_p = (pointer)&(pOVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pOVar2->ident_,local_48,local_40 + (long)local_48);
  pOVar2->_vptr_OptimizationCreator = (_func_int **)&PTR__OptimizationCreator_00309f50;
  OptimizationFactory::registerOptimization(pOVar1,pOVar2);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  pOVar1 = OptimizationFactory::getInstance();
  pOVar2 = (OptimizationCreator *)operator_new(0x28);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CG","");
  pOVar2->_vptr_OptimizationCreator = (_func_int **)&PTR__OptimizationCreator_00309fa0;
  (pOVar2->ident_)._M_dataplus._M_p = (pointer)&(pOVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pOVar2->ident_,local_48,local_40 + (long)local_48);
  pOVar2->_vptr_OptimizationCreator = (_func_int **)&PTR__OptimizationCreator_00309fc8;
  OptimizationFactory::registerOptimization(pOVar1,pOVar2);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  pOVar1 = OptimizationFactory::getInstance();
  pOVar2 = (OptimizationCreator *)operator_new(0x28);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"BFGS","");
  pOVar2->_vptr_OptimizationCreator = (_func_int **)&PTR__OptimizationCreator_00309fa0;
  (pOVar2->ident_)._M_dataplus._M_p = (pointer)&(pOVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pOVar2->ident_,local_48,local_40 + (long)local_48);
  pOVar2->_vptr_OptimizationCreator = (_func_int **)&PTR__OptimizationCreator_0030a008;
  OptimizationFactory::registerOptimization(pOVar1,pOVar2);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void registerOptimizers() {
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::SteepestDescent>("SD"));
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::ConjugateGradient>("CG"));
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::BFGS>("BFGS"));
  }